

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O2

void __thiscall Uic::writeHeaderProtectionStart(Uic *this)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  Driver::headerFileName((QString *)&local_38,this->drv);
  pQVar1 = (QTextStream *)QTextStream::operator<<(this->out,"#ifndef ");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_38);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"\n");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"#define ");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_38);
  QTextStream::operator<<(pQVar1,"\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Uic::writeHeaderProtectionStart()
{
    QString h = drv->headerFileName();
    out << "#ifndef " << h << "\n"
        << "#define " << h << "\n";
}